

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTimestamp.cxx
# Opt level: O0

string * __thiscall
cmTimestamp::AddTimestampComponent_abi_cxx11_
          (string *__return_storage_ptr__,cmTimestamp *this,char flag,tm *timeStruct)

{
  int iVar1;
  char *__format;
  size_t sVar2;
  allocator local_81;
  size_t local_80;
  size_t size;
  char buffer [16];
  allocator local_49;
  string local_48 [8];
  string formatString;
  tm *timeStruct_local;
  char flag_local;
  cmTimestamp *this_local;
  
  formatString.field_2._8_8_ = timeStruct;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"%",&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::__cxx11::string::operator+=(local_48,flag);
  iVar1 = (int)flag;
  if ((((((iVar1 - 0x48U < 2) || (iVar1 == 0x4d)) || (iVar1 == 0x53)) ||
       ((iVar1 == 0x55 || (iVar1 == 0x59)))) ||
      ((iVar1 == 100 || ((iVar1 == 0x6a || (iVar1 == 0x6d)))))) ||
     ((iVar1 == 0x77 || (iVar1 == 0x79)))) {
    __format = (char *)std::__cxx11::string::c_str();
    sVar2 = strftime((char *)&size,0x10,__format,(tm *)formatString.field_2._8_8_);
    local_80 = sVar2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)&size,sVar2,&local_81);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,local_48);
  }
  std::__cxx11::string::~string(local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string cmTimestamp::AddTimestampComponent(
  char flag, struct tm& timeStruct)
{
  std::string formatString = "%";
  formatString += flag;

  switch(flag)
    {
    case 'd':
    case 'H':
    case 'I':
    case 'j':
    case 'm':
    case 'M':
    case 'S':
    case 'U':
    case 'w':
    case 'y':
    case 'Y':
      break;
    default:
      {
      return formatString;
      }
    }

  char buffer[16];

  size_t size = strftime(buffer, sizeof(buffer),
    formatString.c_str(), &timeStruct);

  return std::string(buffer, size);
}